

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::TexSubImage2DEmptyTexCase::createTexture(TexSubImage2DEmptyTexCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 type;
  uint uVar3;
  deUint32 dVar4;
  uint uVar5;
  uint uVar6;
  int ndx_1;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int height;
  int ndx;
  float fVar11;
  deUint32 tex;
  ContextWrapper *local_e8;
  ulong local_e0;
  Vec4 gMax;
  TextureFormat fmt;
  Vec4 gMin;
  PixelBufferAccess local_a8;
  float local_78 [4];
  Random rnd;
  TextureLevel data;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  iVar7 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar6 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar5 = 0x20;
    if (uVar6 != 0) {
      uVar5 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x1f;
    }
    uVar6 = (this->super_TextureSpecCase).m_height;
    if (uVar6 != 0) {
      uVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar7 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar5)) {
      iVar7 = 0x1f - uVar5;
    }
    iVar7 = iVar7 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_e8 = this_00;
  if (iVar7 != 0) {
    iVar8 = 0;
    do {
      iVar10 = (this->super_TextureSpecCase).m_width >> ((byte)iVar8 & 0x1f);
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      height = (this->super_TextureSpecCase).m_height >> ((byte)iVar8 & 0x1f);
      if (height < 2) {
        height = 1;
      }
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,iVar8,this->m_format,iVar10,height,0,this->m_format,this->m_dataType,
                 (void *)0x0);
      iVar8 = iVar8 + 1;
    } while (iVar7 != iVar8);
    iVar8 = 0;
    do {
      iVar10 = (this->super_TextureSpecCase).m_width >> ((byte)iVar8 & 0x1f);
      uVar6 = (this->super_TextureSpecCase).m_height >> ((byte)iVar8 & 0x1f);
      local_a8.super_ConstPixelBufferAccess.m_format.order = R;
      local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      if (iVar10 < 2) {
        iVar10 = 1;
      }
      gMax.m_data[0] = 1.0;
      gMax.m_data[1] = 1.0;
      gMax.m_data[2] = 1.0;
      gMax.m_data[3] = 1.0;
      if ((int)uVar6 < 2) {
        uVar6 = 1;
      }
      local_e0 = (ulong)uVar6;
      gMin.m_data[0] = 0.0;
      gMin.m_data[1] = 0.0;
      gMin.m_data[2] = 0.0;
      gMin.m_data[3] = 0.0;
      lVar9 = 0;
      do {
        fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2];
        fVar2 = gMax.m_data[lVar9];
        fVar11 = deRandom_getFloat(&rnd.m_rnd);
        gMin.m_data[lVar9] = (fVar2 - fVar1) * fVar11 + fVar1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      local_a8.super_ConstPixelBufferAccess.m_format.order = R;
      local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
      local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
      local_78[0] = 1.0;
      local_78[1] = 1.0;
      local_78[2] = 1.0;
      local_78[3] = 1.0;
      gMax.m_data[0] = 0.0;
      gMax.m_data[1] = 0.0;
      gMax.m_data[2] = 0.0;
      gMax.m_data[3] = 0.0;
      lVar9 = 0;
      do {
        fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar9 + -2];
        fVar2 = local_78[lVar9];
        fVar11 = deRandom_getFloat(&rnd.m_rnd);
        gMax.m_data[lVar9] = (fVar2 - fVar1) * fVar11 + fVar1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 4);
      tcu::TextureLevel::setSize(&data,iVar10,(int)local_e0,1);
      tcu::TextureLevel::getAccess(&local_a8,&data);
      tcu::fillWithComponentGradients(&local_a8,&gMin,&gMax);
      dVar4 = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_a8,&data);
      sglr::ContextWrapper::glTexSubImage2D
                (local_e8,0xde1,iVar8,0,0,iVar10,(int)local_e0,dVar4,type,
                 local_a8.super_ConstPixelBufferAccess.m_data);
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar7);
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First allocate storage for each level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify pixel data to all levels using glTexSubImage2D()
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd);
			Vec4	gMax		= randomVector<4>(rnd);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}